

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithAmpersands_Test::
TEST_JUnitOutputTest_testFailureWithAmpersands_Test
          (TEST_JUnitOutputTest_testFailureWithAmpersands_Test *this)

{
  TEST_JUnitOutputTest_testFailureWithAmpersands_Test *this_local;
  
  memset(this,0,0x28);
  TEST_GROUP_CppUTestGroupJUnitOutputTest::TEST_GROUP_CppUTestGroupJUnitOutputTest
            (&this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest);
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_JUnitOutputTest_testFailureWithAmpersands_Test_003d1428;
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithAmpersands)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("&object1 != &object2", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: &amp;object1 != &amp;object2\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}